

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_lore_friends_base(parser *p)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *puVar5;
  char *pcVar6;
  monster_base *pmVar7;
  random_conflict rVar8;
  char *role_name;
  wchar_t wStack_34;
  random number;
  monster_friends_base *f;
  monster_lore *l;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    puVar5 = (undefined8 *)mem_zalloc(0x20);
    rVar8 = parser_getrand(p,"number");
    wStack_34 = rVar8.dice;
    *(wchar_t *)(puVar5 + 3) = wStack_34;
    number.base = rVar8.sides;
    *(int *)((long)puVar5 + 0x1c) = number.base;
    uVar2 = parser_getuint(p,"chance");
    *(uint *)((long)puVar5 + 0x14) = uVar2;
    pcVar6 = parser_getsym(p,"name");
    pmVar7 = lookup_monster_base(pcVar6);
    puVar5[1] = pmVar7;
    if (puVar5[1] == 0) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      _Var1 = parser_hasval(p,"role");
      if (_Var1) {
        pcVar6 = parser_getsym(p,"role");
        iVar3 = strcmp(pcVar6,"servant");
        if (iVar3 == 0) {
          *(undefined4 *)(puVar5 + 2) = 1;
        }
        else {
          iVar3 = strcmp(pcVar6,"bodyguard");
          if (iVar3 != 0) {
            return PARSE_ERROR_INVALID_MONSTER_ROLE;
          }
          *(undefined4 *)(puVar5 + 2) = 2;
        }
      }
      else {
        *(undefined4 *)(puVar5 + 2) = 3;
      }
      *puVar5 = *(undefined8 *)((long)pvVar4 + 0x50);
      *(undefined8 **)((long)pvVar4 + 0x50) = puVar5;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_lore_friends_base(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_friends_base *f;
	struct random number;

	if (!l)
		return PARSE_ERROR_NONE;
	f = mem_zalloc(sizeof *f);
	number = parser_getrand(p, "number");
	f->number_dice = number.dice;
	f->number_side = number.sides;
	f->percent_chance = parser_getuint(p, "chance");
	f->base = lookup_monster_base(parser_getsym(p, "name"));
	if (!f->base) return PARSE_ERROR_UNRECOGNISED_TVAL;
	if (parser_hasval(p, "role")) {
		const char *role_name = parser_getsym(p, "role");
		if (streq(role_name, "servant")) {
			f->role = MON_GROUP_SERVANT;
		} else if (streq(role_name, "bodyguard")) {
			f->role = MON_GROUP_BODYGUARD;
		} else {
			return PARSE_ERROR_INVALID_MONSTER_ROLE;
		}
	} else {
		f->role = MON_GROUP_MEMBER;
	}

	f->next = l->friends_base;
	l->friends_base = f;

	return PARSE_ERROR_NONE;
}